

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O3

void __thiscall
flatbuffers::python::PythonGenerator::GenPackForStructField
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_prefix_ptr,
          string *code_ptr)

{
  IdlNamer *pIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  string field_field;
  string struct_type;
  string field_method;
  long *local_170;
  long local_160;
  long lStack_158;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  long *local_130;
  long local_128;
  long local_120;
  long lStack_118;
  string local_110;
  long *local_f0 [2];
  long local_e0 [2];
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  string local_50;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x12])(local_f0,pIVar1);
  (*(this->namer_).super_Namer._vptr_Namer[4])(local_70,pIVar1,field);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(local_90,pIVar1,struct_def);
  if (((field->value).type.struct_def)->fixed == true) {
    GenIndents_abi_cxx11_(&local_110,this,2);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_140 = *plVar4;
      lStack_138 = plVar3[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar4;
      local_150 = (long *)*plVar3;
    }
    local_148 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0[0]);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_120 = *plVar4;
      lStack_118 = plVar3[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar4;
      local_130 = (long *)*plVar3;
    }
    local_128 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_160 = *plVar4;
      lStack_158 = plVar3[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar4;
      local_170 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_170);
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    paVar2 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_d0,this,3);
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0[0]);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_110.field_2._M_allocated_capacity = *psVar5;
      local_110.field_2._8_8_ = plVar3[3];
      local_110._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar5;
      local_110._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_110._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_140 = *plVar4;
      lStack_138 = plVar3[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar4;
      local_150 = (long *)*plVar3;
    }
    local_148 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0[0]);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_120 = *plVar4;
      lStack_118 = plVar3[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar4;
      local_130 = (long *)*plVar3;
    }
    local_128 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_160 = *plVar4;
      lStack_158 = plVar3[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar4;
      local_170 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_170);
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_0029265d;
  }
  else {
    GenIndents_abi_cxx11_(&local_110,this,2);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_140 = *plVar4;
      lStack_138 = plVar3[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar4;
      local_150 = (long *)*plVar3;
    }
    local_148 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0[0]);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_120 = *plVar4;
      lStack_118 = plVar3[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar4;
      local_130 = (long *)*plVar3;
    }
    local_128 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_160 = *plVar4;
      lStack_158 = plVar3[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar4;
      local_170 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_170);
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    paVar2 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_d0,this,3);
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0[0]);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_110.field_2._M_allocated_capacity = *psVar5;
      local_110.field_2._8_8_ = plVar3[3];
      local_110._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar5;
      local_110._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_110._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_140 = *plVar4;
      lStack_138 = plVar3[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar4;
      local_150 = (long *)*plVar3;
    }
    local_148 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0[0]);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_120 = *plVar4;
      lStack_118 = plVar3[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar4;
      local_130 = (long *)*plVar3;
    }
    local_128 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_160 = *plVar4;
      lStack_158 = plVar3[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar4;
      local_170 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_prefix_ptr,(ulong)local_170);
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    GenIndents_abi_cxx11_(&local_110,this,2);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_140 = *plVar4;
      lStack_138 = plVar3[3];
      local_150 = &local_140;
    }
    else {
      local_140 = *plVar4;
      local_150 = (long *)*plVar3;
    }
    local_148 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0[0]);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_120 = *plVar4;
      lStack_118 = plVar3[3];
      local_130 = &local_120;
    }
    else {
      local_120 = *plVar4;
      local_130 = (long *)*plVar3;
    }
    local_128 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_160 = *plVar4;
      lStack_158 = plVar3[3];
      local_170 = &local_160;
    }
    else {
      local_160 = *plVar4;
      local_170 = (long *)*plVar3;
    }
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_170);
    if (local_170 != &local_160) {
      operator_delete(local_170,local_160 + 1);
    }
    if (local_130 != &local_120) {
      operator_delete(local_130,local_120 + 1);
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,local_140 + 1);
    }
    local_d0.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
    local_d0._M_dataplus._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar2) goto LAB_0029265d;
  }
  operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
LAB_0029265d:
  GenIndents_abi_cxx11_(&local_50,this,3);
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90[0]);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_a0 = *plVar4;
    lStack_98 = plVar3[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar4;
    local_b0 = (long *)*plVar3;
  }
  local_a8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0.field_2._8_8_ = plVar3[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar5;
    local_d0._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_d0._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_70[0]);
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_110.field_2._M_allocated_capacity = *psVar5;
    local_110.field_2._8_8_ = plVar3[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *psVar5;
    local_110._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_110._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_140 = *plVar4;
    lStack_138 = plVar3[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *plVar4;
    local_150 = (long *)*plVar3;
  }
  local_148 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0[0]);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_120 = *plVar4;
    lStack_118 = plVar3[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *plVar4;
    local_130 = (long *)*plVar3;
  }
  local_128 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_130);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_160 = *plVar4;
    lStack_158 = plVar3[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *plVar4;
    local_170 = (long *)*plVar3;
  }
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_170);
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  return;
}

Assistant:

void GenPackForStructField(const StructDef &struct_def, const FieldDef &field,
                             std::string *code_prefix_ptr,
                             std::string *code_ptr) const {
    auto &code_prefix = *code_prefix_ptr;
    auto &code = *code_ptr;
    const auto field_field = namer_.Field(field);
    const auto field_method = namer_.Method(field);
    const auto struct_type = namer_.Type(struct_def);

    if (field.value.type.struct_def->fixed) {
      // Pure struct fields need to be created along with their parent
      // structs.
      code += GenIndents(2) + "if self." + field_field + " is not None:";
      code += GenIndents(3) + field_field + " = self." + field_field +
              ".Pack(builder)";
    } else {
      // Tables need to be created before their parent structs are created.
      code_prefix += GenIndents(2) + "if self." + field_field + " is not None:";
      code_prefix += GenIndents(3) + field_field + " = self." + field_field +
                     ".Pack(builder)";
      code += GenIndents(2) + "if self." + field_field + " is not None:";
    }

    code += GenIndents(3) + struct_type + "Add" + field_method + "(builder, " +
            field_field + ")";
  }